

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsParser.cpp
# Opt level: O2

int * gsdTime(void)

{
  tm *ptVar1;
  time_t now;
  time_t local_8;
  
  if (gsdTime()::timeSet == '\0') {
    local_8 = time((time_t *)0x0);
    ptVar1 = localtime(&local_8);
    gsdTime::timeIO[5] = ptVar1->tm_sec;
    gsdTime::timeIO[4] = ptVar1->tm_min;
    gsdTime::timeIO[3] = ptVar1->tm_hour;
    gsdTime::timeIO[2] = ptVar1->tm_mday;
    gsdTime::timeIO[0] = ptVar1->tm_year + 0x76c;
    gsdTime()::timeSet = '\x01';
    gsdTime::timeIO[1] = ptVar1->tm_mon + 1;
    gsdTime::timeIO[6] = gsdTime::timeIO[0];
    gsdTime::timeIO[7] = gsdTime::timeIO[1];
    gsdTime::timeIO[8] = gsdTime::timeIO[2];
    gsdTime::timeIO[9] = gsdTime::timeIO[3];
    gsdTime::timeIO[10] = gsdTime::timeIO[4];
    gsdTime::timeIO[0xb] = gsdTime::timeIO[5];
  }
  return gsdTime::timeIO;
}

Assistant:

int *gsdTime()
{
  static int timeIO[12];
  static bool timeSet = false;
  tm lctn;

  if (!timeSet) {
    time_t now = time(0);
    lctn = *localtime(&now);
    timeSet = true;

    timeIO[0] = lctn.tm_year + 1900;
    timeIO[1] = lctn.tm_mon + 1;
    timeIO[2] = lctn.tm_mday;
    timeIO[3] = lctn.tm_hour;
    timeIO[4] = lctn.tm_min;
    timeIO[5] = lctn.tm_sec;
    timeIO[6] = timeIO[0];
    timeIO[7] = timeIO[1];
    timeIO[8] = timeIO[2];
    timeIO[9] = timeIO[3];
    timeIO[10] = timeIO[4];
    timeIO[11] = timeIO[5];
  }

  return timeIO;
}